

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

void __thiscall Indexing::CodeTree::SearchStruct::destroy(SearchStruct *this)

{
  if (this->kind == GROUND_TERM_STRUCT) {
    SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)1>::~SearchStructImpl
              ((SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)1> *)this);
  }
  else {
    if (this->kind != FN_STRUCT) {
      return;
    }
    SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)0>::~SearchStructImpl
              ((SearchStructImpl<(Indexing::CodeTree::SearchStruct::Kind)0> *)this);
  }
  ::operator_delete(this,0x48);
  return;
}

Assistant:

void CodeTree::SearchStruct::destroy()
{
  switch(kind) {
  case FN_STRUCT:
    delete static_cast<FnSearchStruct*>(this);
    break;
  case GROUND_TERM_STRUCT:
    delete static_cast<GroundTermSearchStruct*>(this);
    break;
  }
}